

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall
SourceMapTest_SourcesContent_Test::~SourceMapTest_SourcesContent_Test
          (SourceMapTest_SourcesContent_Test *this)

{
  SourceMapReader *pSVar1;
  pointer pcVar2;
  
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0fc0;
  pSVar1 = (this->super_SourceMapTest).reader._M_t.
           super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
           .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl;
  if (pSVar1 != (SourceMapReader *)0x0) {
    operator_delete(pSVar1,0x40);
  }
  (this->super_SourceMapTest).reader._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = (SourceMapReader *)0x0;
  ::wasm::Module::~Module(&(this->super_SourceMapTest).wasm);
  pcVar2 = (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->super_SourceMapTest).buffer.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourcesContent) {
  // The backslash escapes appear in the JSON encoding, and are preserved in
  // the internal representation. The string values are uninterpreted in
  // Binaryen, and they are written directly back out without re-encoding.
  std::string sourceMap = R"(
   {
     "version": 3,
     "sources": ["foo.c"],
     "sourcesContent": ["#include <stdio.h> int main()\n{ printf(\"Gr\u00fc\u00df Gott, Welt!\"); return 0;}"],
     "mappings" : ""
   }
  )";
  parseMap(sourceMap);
  ASSERT_EQ(wasm.debugInfoSourcesContent.size(), 1);
  EXPECT_EQ(wasm.debugInfoSourcesContent[0],
            "#include <stdio.h> int main()\\n{ printf(\\\"Gr\\u00fc\\u00df "
            "Gott, Welt!\\\"); return 0;}");
}